

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMakeLocalFileName>::copyAppend
          (QGenericArrayOps<QMakeLocalFileName> *this,QMakeLocalFileName *b,QMakeLocalFileName *e)

{
  QMakeLocalFileName *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    do {
      pDVar2 = (b->real_name).d.d;
      pQVar1[lVar3].real_name.d.d = pDVar2;
      pQVar1[lVar3].real_name.d.ptr = (b->real_name).d.ptr;
      pQVar1[lVar3].real_name.d.size = (b->real_name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->local_name).d.d;
      pQVar1[lVar3].local_name.d.d = pDVar2;
      pQVar1[lVar3].local_name.d.ptr = (b->local_name).d.ptr;
      pQVar1[lVar3].local_name.d.size = (b->local_name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size + 1;
      (this->super_QArrayDataPointer<QMakeLocalFileName>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }